

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O0

K __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::remove_min(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
             *this)

{
  bool bVar1;
  RBPath *in_RDI;
  RBPath path;
  K result;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *in_stack_fffffffffffff7e0;
  undefined1 in_stack_fffffffffffff807;
  RBPath *in_stack_fffffffffffff808;
  RBPath *in_stack_fffffffffffffbd0;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *in_stack_fffffffffffffbd8;
  FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  *local_8;
  
  bVar1 = is_empty(in_stack_fffffffffffff7e0);
  if (bVar1) {
    local_8 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
               *)0x0;
  }
  else {
    get_root_path(in_stack_fffffffffffff7e0);
    do {
      bVar1 = RBPath::move(in_stack_fffffffffffff808,(bool)in_stack_fffffffffffff807);
    } while (bVar1);
    RBPath::curr(in_RDI);
    local_8 = (FreeChunk<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
               *)snmalloc::RBTree::ChildRef::operator_cast_to_CapPtr((ChildRef *)in_RDI);
    remove_path(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  }
  return (K)local_8;
}

Assistant:

K remove_min()
    {
      if (is_empty())
        return Rep::null;

      auto path = get_root_path();
      while (path.move(true))
      {}

      K result = path.curr();

      remove_path(path);
      return result;
    }